

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

vector<DevMap> *
anon_unknown.dwarf_254152::probe_devices
          (vector<DevMap> *__return_storage_ptr__,snd_pcm_stream_t stream)

{
  _Alloc_hider _Var1;
  bool bVar2;
  uint uVar3;
  FILE *pFVar4;
  snd_pcm_stream_t sVar5;
  _GLOBAL__N_1 _Var6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  long *plVar12;
  undefined8 uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong *puVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  char cVar20;
  string spec;
  int dev;
  int card;
  string name;
  snd_pcm_info_t *pcminfo;
  snd_ctl_t *handle;
  snd_ctl_card_info_t *info;
  string device;
  string main_prefix;
  undefined1 local_168 [40];
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  uint local_128;
  uint local_124;
  _GLOBAL__N_1 *local_120;
  ulong *local_118;
  _Alloc_hider local_110;
  ulong local_108;
  ulong uStack_100;
  vector<DevMap> *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  snd_pcm_stream_t local_dc;
  undefined8 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  ulong local_a8;
  ulong local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_98;
  _Alloc_hider local_90;
  ulong local_88;
  ulong local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_78;
  long local_70;
  char *local_68;
  _GLOBAL__N_1 *local_60;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = __return_storage_ptr__;
  (*(anonymous_namespace)::psnd_ctl_card_info_malloc)(&local_d8);
  (*(anonymous_namespace)::psnd_pcm_info_malloc)(&local_f0);
  local_168._0_8_ = local_168 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ALSA Default","");
  pcVar17 = "capture";
  if (stream == SND_PCM_STREAM_PLAYBACK) {
    pcVar17 = "device";
  }
  pcVar17 = GetConfigValue((char *)0x0,"alsa",pcVar17,"default");
  std::__cxx11::string::string((string *)(local_168 + 0x20),pcVar17,(allocator *)&local_50);
  std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
  emplace_back<(anonymous_namespace)::DevMap>(local_f8,(DevMap *)local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._32_8_ != &local_138) {
    operator_delete((void *)local_168._32_8_,local_138._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  pcVar17 = "custom-captures";
  if (stream == SND_PCM_STREAM_PLAYBACK) {
    pcVar17 = "custom-devices";
  }
  local_dc = stream;
  pcVar17 = GetConfigValue((char *)0x0,"alsa",pcVar17,(char *)(AlsaPlayback::reset::channellist + 4)
                          );
  if (pcVar17 != (char *)0x0) {
    local_120 = (_GLOBAL__N_1 *)
                &(local_f8->
                 super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (*pcVar17 == '\0') break;
      pcVar9 = strchr(pcVar17,0x3b);
      pcVar10 = strchr(pcVar17,0x3d);
      if (pcVar10 == (char *)0x0) {
        if (pcVar9 == (char *)0x0) {
          local_168._0_8_ = local_168 + 0x10;
          sVar11 = strlen(pcVar17);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,pcVar17,pcVar17 + sVar11);
          pcVar17 = (char *)0x0;
        }
        else {
          local_168._0_8_ = local_168 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar17,pcVar9);
          pcVar17 = pcVar9 + 1;
        }
        if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::probe_devices((_GLOBAL__N_1 *)local_168);
        }
        if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
          operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
        }
      }
      else {
        local_168._0_8_ = local_168 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar17,pcVar10);
        pcVar10 = pcVar10 + 1;
        local_168._32_8_ = &local_138;
        if (pcVar9 == (char *)0x0) {
          sVar11 = strlen(pcVar10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_168 + 0x20),pcVar10,pcVar10 + sVar11);
          pcVar17 = (char *)0x0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_168 + 0x20),pcVar10,pcVar9);
          pcVar17 = pcVar9 + 1;
        }
        std::
        vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
        emplace_back<(anonymous_namespace)::DevMap>(local_f8,(DevMap *)local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._32_8_ != &local_138) {
          operator_delete((void *)local_168._32_8_,local_138._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
          operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
        }
        if (2 < (int)gLogLevel) {
          _GLOBAL__N_1::probe_devices(local_120);
        }
      }
    } while (pcVar17 != (char *)0x0);
  }
  sVar5 = local_dc;
  if (SND_PCM_STREAM_CAPTURE < local_dc) {
    __assert_fail("stream == SND_PCM_STREAM_PLAYBACK || stream == SND_PCM_STREAM_CAPTURE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rbetik12[P]FallingSand/lib/vx-sound/lib/openal/alc/backends/alsa.cpp"
                  ,0xfd,"const char *(anonymous namespace)::prefix_name(snd_pcm_stream_t)");
  }
  local_68 = "capture-prefix";
  if (local_dc == SND_PCM_STREAM_PLAYBACK) {
    local_68 = "device-prefix";
  }
  ConfigValueStr_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_168,(char *)0x0,"alsa",local_68);
  al::optional<std::__cxx11::string>::value_or<char_const(&)[8]>
            (&local_50,local_168,(char (*) [8])"plughw:");
  if ((local_168[0] == (_GLOBAL__N_1)0x1) && ((undefined1 *)local_168._8_8_ != local_168 + 0x18)) {
    operator_delete((void *)local_168._8_8_,local_168._24_8_ + 1);
  }
  local_124 = 0xffffffff;
  iVar7 = (*(anonymous_namespace)::psnd_card_next)();
  local_70 = 0xe - (ulong)(sVar5 == SND_PCM_STREAM_PLAYBACK);
  local_60 = (_GLOBAL__N_1 *)
             &(local_f8->
              super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  do {
    uVar3 = local_124;
    pFVar4 = gLogFile;
    if ((iVar7 < 0) || ((int)local_124 < 0)) {
      if ((iVar7 < 0) && (0 < (int)gLogLevel)) {
        uVar13 = (*(anonymous_namespace)::psnd_strerror)(iVar7);
        fprintf((FILE *)pFVar4,"[ALSOFT] (EE) snd_card_next failed: %s\n",uVar13);
      }
      (*(anonymous_namespace)::psnd_pcm_info_free)(local_f0);
      (*(anonymous_namespace)::psnd_ctl_card_info_free)(local_d8);
      paVar14 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar14) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        paVar14 = extraout_RAX;
      }
      return (vector<DevMap> *)paVar14;
    }
    uVar18 = 1;
    if (9 < local_124) {
      uVar19 = local_124;
      uVar8 = 4;
      do {
        uVar18 = uVar8;
        if (uVar19 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_00160014;
        }
        if (uVar19 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_00160014;
        }
        if (uVar19 < 10000) goto LAB_00160014;
        bVar2 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        uVar8 = uVar18 + 4;
      } while (bVar2);
      uVar18 = uVar18 + 1;
    }
LAB_00160014:
    local_168._0_8_ = local_168 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_168,(char)uVar18);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_168._0_8_,uVar18,uVar3);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x192326);
    local_118 = &local_108;
    puVar15 = (ulong *)(plVar12 + 2);
    if ((ulong *)*plVar12 == puVar15) {
      local_108 = *puVar15;
      uStack_100 = plVar12[3];
    }
    else {
      local_108 = *puVar15;
      local_118 = (ulong *)*plVar12;
    }
    local_110._M_p = (pointer)plVar12[1];
    *plVar12 = (long)puVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    iVar7 = (*(anonymous_namespace)::psnd_ctl_open)(&local_e8,local_118,0);
    pFVar4 = gLogFile;
    if (iVar7 < 0) {
      if (0 < (int)gLogLevel) {
        local_120 = (_GLOBAL__N_1 *)CONCAT44(local_120._4_4_,local_124);
        uVar13 = (*(anonymous_namespace)::psnd_strerror)(iVar7);
        fprintf((FILE *)pFVar4,"[ALSOFT] (EE) control open (hw:%d): %s\n",
                (ulong)local_120 & 0xffffffff,uVar13);
      }
    }
    else {
      iVar7 = (*(anonymous_namespace)::psnd_ctl_card_info)(local_e8);
      pFVar4 = gLogFile;
      if (iVar7 < 0) {
        if (0 < (int)gLogLevel) {
          local_120 = (_GLOBAL__N_1 *)CONCAT44(local_120._4_4_,local_124);
          uVar13 = (*(anonymous_namespace)::psnd_strerror)(iVar7);
          fprintf((FILE *)pFVar4,"[ALSOFT] (EE) control hardware info (hw:%d): %s\n",
                  (ulong)local_120 & 0xffffffff,uVar13);
        }
        (*(anonymous_namespace)::psnd_ctl_close)(local_e8);
      }
      else {
        local_58 = (char *)(*(anonymous_namespace)::psnd_ctl_card_info_get_name)(local_d8);
        local_120 = (_GLOBAL__N_1 *)(*(anonymous_namespace)::psnd_ctl_card_info_get_id)(local_d8);
        _Var1._M_p = local_168 + 0x18;
        std::__cxx11::string::_M_replace((ulong)&local_118,0,local_110._M_p,(ulong)local_68);
        cVar20 = (char)&local_118;
        std::__cxx11::string::push_back(cVar20);
        std::__cxx11::string::append((char *)&local_118);
        ConfigValueStr_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_168,(char *)0x0,"alsa",(char *)local_118);
        local_90._M_p = (pointer)&local_80;
        if (local_168[0] == (_GLOBAL__N_1)0x1) {
          if ((pointer)local_168._8_8_ == _Var1._M_p) {
            paStack_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_168._32_8_;
          }
          else {
            local_90._M_p = (pointer)local_168._8_8_;
          }
          local_80 = local_168._24_8_;
          local_88 = local_168._16_8_;
          local_168._16_8_ = 0;
          local_168._24_8_ = local_168._24_8_ & 0xffffffffffffff00;
          _Var6 = (_GLOBAL__N_1)0x1;
          local_168._8_8_ = _Var1._M_p;
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_50._M_dataplus._M_p,
                     local_50._M_dataplus._M_p + local_50._M_string_length);
          _Var6 = local_168[0];
        }
        if ((((byte)_Var6 & 1) != 0) && ((pointer)local_168._8_8_ != _Var1._M_p)) {
          operator_delete((void *)local_168._8_8_,local_168._24_8_ + 1);
        }
        local_128 = 0xffffffff;
        while( true ) {
          iVar7 = (*(anonymous_namespace)::psnd_ctl_pcm_next_device)(local_e8,&local_128);
          if ((iVar7 < 0) && (0 < (int)gLogLevel)) {
            _GLOBAL__N_1::probe_devices();
          }
          if ((int)local_128 < 0) break;
          (*(anonymous_namespace)::psnd_pcm_info_set_device)(local_f0);
          (*(anonymous_namespace)::psnd_pcm_info_set_subdevice)(local_f0,0);
          (*(anonymous_namespace)::psnd_pcm_info_set_stream)(local_f0,local_dc);
          iVar7 = (*(anonymous_namespace)::psnd_ctl_pcm_info)(local_e8);
          uVar3 = local_124;
          pFVar4 = gLogFile;
          if (iVar7 < 0) {
            if ((iVar7 != -2) && (0 < (int)gLogLevel)) {
              uVar13 = (*(anonymous_namespace)::psnd_strerror)(iVar7);
              fprintf((FILE *)pFVar4,"[ALSOFT] (EE) control digital audio info (hw:%d): %s\n",
                      (ulong)uVar3,uVar13);
            }
          }
          else {
            std::__cxx11::string::_M_replace((ulong)&local_118,0,local_110._M_p,(ulong)local_68);
            std::__cxx11::string::push_back(cVar20);
            std::__cxx11::string::append((char *)&local_118);
            std::__cxx11::string::push_back(cVar20);
            uVar3 = -local_128;
            if (0 < (int)local_128) {
              uVar3 = local_128;
            }
            uVar18 = 1;
            if (9 < uVar3) {
              uVar16 = (ulong)uVar3;
              uVar19 = 4;
              do {
                uVar18 = uVar19;
                uVar8 = (uint)uVar16;
                if (uVar8 < 100) {
                  uVar18 = uVar18 - 2;
                  goto LAB_001603f1;
                }
                if (uVar8 < 1000) {
                  uVar18 = uVar18 - 1;
                  goto LAB_001603f1;
                }
                if (uVar8 < 10000) goto LAB_001603f1;
                uVar16 = uVar16 / 10000;
                uVar19 = uVar18 + 4;
              } while (99999 < uVar8);
              uVar18 = uVar18 + 1;
            }
LAB_001603f1:
            uVar19 = local_128 >> 0x1f;
            local_168._0_8_ = local_168 + 0x10;
            std::__cxx11::string::_M_construct
                      ((ulong)local_168,(char)uVar18 - (char)((int)local_128 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_168._0_8_ + (ulong)uVar19),uVar18,uVar3);
            std::__cxx11::string::_M_append((char *)&local_118,local_168._0_8_);
            if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            ConfigValueStr_abi_cxx11_
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_168,(char *)0x0,"alsa",(char *)local_118);
            _Var1._M_p = local_168 + 0x18;
            local_b0._M_p = (pointer)&local_a0;
            if (local_168[0] == (_GLOBAL__N_1)0x1) {
              if ((pointer)local_168._8_8_ == _Var1._M_p) {
                paStack_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)local_168._32_8_;
              }
              else {
                local_b0._M_p = (pointer)local_168._8_8_;
              }
              local_a0 = local_168._24_8_;
              local_a8 = local_168._16_8_;
              local_168._16_8_ = 0;
              local_168._24_8_ = local_168._24_8_ & 0xffffffffffffff00;
              _Var6 = (_GLOBAL__N_1)0x1;
              local_168._8_8_ = _Var1._M_p;
            }
            else {
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,local_90._M_p,(long)local_90._M_p + local_88);
              _Var6 = local_168[0];
            }
            if ((((byte)_Var6 & 1) != 0) && ((pointer)local_168._8_8_ != _Var1._M_p)) {
              operator_delete((void *)local_168._8_8_,local_168._24_8_ + 1);
            }
            pcVar17 = local_58;
            _Var1._M_p = local_110._M_p;
            strlen(local_58);
            std::__cxx11::string::_M_replace((ulong)&local_118,0,_Var1._M_p,(ulong)pcVar17);
            std::__cxx11::string::append((char *)&local_118);
            (*(anonymous_namespace)::psnd_pcm_info_get_name)(local_f0);
            std::__cxx11::string::append((char *)&local_118);
            std::__cxx11::string::append((char *)&local_118);
            std::__cxx11::string::append((char *)&local_118);
            std::__cxx11::string::append((char *)&local_118);
            uVar3 = -local_128;
            if (0 < (int)local_128) {
              uVar3 = local_128;
            }
            uVar18 = 1;
            if (9 < uVar3) {
              uVar16 = (ulong)uVar3;
              uVar19 = 4;
              do {
                uVar18 = uVar19;
                uVar8 = (uint)uVar16;
                if (uVar8 < 100) {
                  uVar18 = uVar18 - 2;
                  goto LAB_001605e8;
                }
                if (uVar8 < 1000) {
                  uVar18 = uVar18 - 1;
                  goto LAB_001605e8;
                }
                if (uVar8 < 10000) goto LAB_001605e8;
                uVar16 = uVar16 / 10000;
                uVar19 = uVar18 + 4;
              } while (99999 < uVar8);
              uVar18 = uVar18 + 1;
            }
LAB_001605e8:
            uVar19 = local_128 >> 0x1f;
            local_168._0_8_ = local_168 + 0x10;
            std::__cxx11::string::_M_construct
                      ((ulong)local_168,(char)uVar18 - (char)((int)local_128 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_168._0_8_ + (ulong)uVar19),uVar18,uVar3);
            std::__cxx11::string::_M_append((char *)&local_118,local_168._0_8_);
            if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            std::__cxx11::string::push_back(cVar20);
            local_d0 = &local_c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_b0._M_p,(long)local_b0._M_p + local_a8);
            std::__cxx11::string::append((char *)&local_d0);
            std::__cxx11::string::append((char *)&local_d0);
            std::__cxx11::string::append((char *)&local_d0);
            uVar3 = -local_128;
            if (0 < (int)local_128) {
              uVar3 = local_128;
            }
            uVar18 = 1;
            if (9 < uVar3) {
              uVar16 = (ulong)uVar3;
              uVar19 = 4;
              do {
                uVar18 = uVar19;
                uVar8 = (uint)uVar16;
                if (uVar8 < 100) {
                  uVar18 = uVar18 - 2;
                  goto LAB_00160710;
                }
                if (uVar8 < 1000) {
                  uVar18 = uVar18 - 1;
                  goto LAB_00160710;
                }
                if (uVar8 < 10000) goto LAB_00160710;
                uVar16 = uVar16 / 10000;
                uVar19 = uVar18 + 4;
              } while (99999 < uVar8);
              uVar18 = uVar18 + 1;
            }
LAB_00160710:
            uVar19 = local_128 >> 0x1f;
            local_168._0_8_ = local_168 + 0x10;
            std::__cxx11::string::_M_construct
                      ((ulong)local_168,(char)uVar18 - (char)((int)local_128 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_168._0_8_ + (ulong)uVar19),uVar18,uVar3);
            std::__cxx11::string::_M_append((char *)&local_d0,local_168._0_8_);
            puVar15 = (ulong *)(local_168 + 0x10);
            if ((ulong *)local_168._0_8_ != puVar15) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            if (local_118 == &local_108) {
              local_168._24_8_ = uStack_100;
              local_168._0_8_ = puVar15;
            }
            else {
              local_168._0_8_ = local_118;
            }
            local_168._16_8_ = local_108;
            local_168._8_8_ = local_110._M_p;
            local_110._M_p = (pointer)0x0;
            local_108 = local_108 & 0xffffffffffffff00;
            if (local_d0 == &local_c0) {
              local_138._8_8_ = local_c0._8_8_;
              local_168._32_8_ = &local_138;
            }
            else {
              local_168._32_8_ = local_d0;
            }
            local_138._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
            local_138._M_local_buf[0] = local_c0._M_local_buf[0];
            local_140 = local_c8;
            local_c8 = 0;
            local_c0._M_local_buf[0] = '\0';
            local_118 = &local_108;
            local_d0 = &local_c0;
            std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::emplace_back<(anonymous_namespace)::DevMap>(local_f8,(DevMap *)local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._32_8_ != &local_138) {
              operator_delete((void *)local_168._32_8_,local_138._M_allocated_capacity + 1);
            }
            if ((ulong *)local_168._0_8_ != puVar15) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            if (2 < (int)gLogLevel) {
              _GLOBAL__N_1::probe_devices(local_60);
            }
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                                local_c0._M_local_buf[0]) + 1);
            }
            if ((ulong *)local_b0._M_p != &local_a0) {
              operator_delete(local_b0._M_p,local_a0 + 1);
            }
          }
        }
        (*(anonymous_namespace)::psnd_ctl_close)(local_e8);
        if ((ulong *)local_90._M_p != &local_80) {
          operator_delete(local_90._M_p,local_80 + 1);
        }
      }
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    iVar7 = (*(anonymous_namespace)::psnd_card_next)(&local_124);
  } while( true );
}

Assistant:

al::vector<DevMap> probe_devices(snd_pcm_stream_t stream)
{
    al::vector<DevMap> devlist;

    snd_ctl_card_info_t *info;
    snd_ctl_card_info_malloc(&info);
    snd_pcm_info_t *pcminfo;
    snd_pcm_info_malloc(&pcminfo);

    devlist.emplace_back(DevMap{alsaDevice,
        GetConfigValue(nullptr, "alsa", (stream==SND_PCM_STREAM_PLAYBACK) ? "device" : "capture",
            "default")});

    const char *customdevs{GetConfigValue(nullptr, "alsa",
        (stream == SND_PCM_STREAM_PLAYBACK) ? "custom-devices" : "custom-captures", "")};
    while(const char *curdev{customdevs})
    {
        if(!curdev[0]) break;
        customdevs = strchr(curdev, ';');
        const char *sep{strchr(curdev, '=')};
        if(!sep)
        {
            std::string spec{customdevs ? std::string(curdev, customdevs++) : std::string(curdev)};
            ERR("Invalid ALSA device specification \"%s\"\n", spec.c_str());
            continue;
        }

        const char *oldsep{sep++};
        devlist.emplace_back(DevMap{std::string(curdev, oldsep),
            customdevs ? std::string(sep, customdevs++) : std::string(sep)});
        const auto &entry = devlist.back();
        TRACE("Got device \"%s\", \"%s\"\n", entry.name.c_str(), entry.device_name.c_str());
    }

    const std::string main_prefix{
        ConfigValueStr(nullptr, "alsa", prefix_name(stream)).value_or("plughw:")};

    int card{-1};
    int err{snd_card_next(&card)};
    for(;err >= 0 && card >= 0;err = snd_card_next(&card))
    {
        std::string name{"hw:" + std::to_string(card)};

        snd_ctl_t *handle;
        if((err=snd_ctl_open(&handle, name.c_str(), 0)) < 0)
        {
            ERR("control open (hw:%d): %s\n", card, snd_strerror(err));
            continue;
        }
        if((err=snd_ctl_card_info(handle, info)) < 0)
        {
            ERR("control hardware info (hw:%d): %s\n", card, snd_strerror(err));
            snd_ctl_close(handle);
            continue;
        }

        const char *cardname{snd_ctl_card_info_get_name(info)};
        const char *cardid{snd_ctl_card_info_get_id(info)};
        name = prefix_name(stream);
        name += '-';
        name += cardid;
        const std::string card_prefix{
            ConfigValueStr(nullptr, "alsa", name.c_str()).value_or(main_prefix)};

        int dev{-1};
        while(1)
        {
            if(snd_ctl_pcm_next_device(handle, &dev) < 0)
                ERR("snd_ctl_pcm_next_device failed\n");
            if(dev < 0) break;

            snd_pcm_info_set_device(pcminfo, static_cast<ALuint>(dev));
            snd_pcm_info_set_subdevice(pcminfo, 0);
            snd_pcm_info_set_stream(pcminfo, stream);
            if((err=snd_ctl_pcm_info(handle, pcminfo)) < 0)
            {
                if(err != -ENOENT)
                    ERR("control digital audio info (hw:%d): %s\n", card, snd_strerror(err));
                continue;
            }

            /* "prefix-cardid-dev" */
            name = prefix_name(stream);
            name += '-';
            name += cardid;
            name += '-';
            name += std::to_string(dev);
            const std::string device_prefix{
                ConfigValueStr(nullptr, "alsa", name.c_str()).value_or(card_prefix)};

            /* "CardName, PcmName (CARD=cardid,DEV=dev)" */
            name = cardname;
            name += ", ";
            name += snd_pcm_info_get_name(pcminfo);
            name += " (CARD=";
            name += cardid;
            name += ",DEV=";
            name += std::to_string(dev);
            name += ')';

            /* "devprefixCARD=cardid,DEV=dev" */
            std::string device{device_prefix};
            device += "CARD=";
            device += cardid;
            device += ",DEV=";
            device += std::to_string(dev);
            
            devlist.emplace_back(DevMap{std::move(name), std::move(device)});
            const auto &entry = devlist.back();
            TRACE("Got device \"%s\", \"%s\"\n", entry.name.c_str(), entry.device_name.c_str());
        }
        snd_ctl_close(handle);
    }
    if(err < 0)
        ERR("snd_card_next failed: %s\n", snd_strerror(err));

    snd_pcm_info_free(pcminfo);
    snd_ctl_card_info_free(info);

    return devlist;
}